

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> * __thiscall
vkb::PhysicalDeviceSelector::select_impl
          (Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
           *__return_storage_ptr__,PhysicalDeviceSelector *this)

{
  GenericFeatureChain *src_extended_features_chain;
  pointer ppVVar1;
  pointer pPVar2;
  VkResult VVar3;
  pointer pGVar4;
  long lVar5;
  pointer ppVVar6;
  long lVar7;
  long lVar8;
  __normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
  __seed;
  PhysicalDevice *physical_device_1;
  pointer phys_dev;
  initializer_list<vkb::PhysicalDevice> __l;
  allocator_type local_e01;
  anon_class_8_1_8991fb9c fill_out_phys_dev_with_criteria;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> vk_physical_devices;
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> local_dd8;
  PhysicalDevice physical_device;
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> physical_devices;
  
  src_extended_features_chain = &(this->criteria).extended_features_chain;
  for (pGVar4 = (this->criteria).extended_features_chain.nodes.
                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pGVar4 != (this->criteria).extended_features_chain.nodes.
                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                ._M_impl.super__Vector_impl_data._M_finish; pGVar4 = pGVar4 + 1) {
    if (pGVar4->sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2) {
      __assert_fail("node.sType != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 && \"Do not pass VkPhysicalDeviceFeatures2 as a required extension feature structure. An \" \"instance of this is managed internally for selection criteria and device creation.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                    ,0x4e1,
                    "Result<std::vector<PhysicalDevice>> vkb::PhysicalDeviceSelector::select_impl() const"
                   );
    }
    if (pGVar4->sType == VK_STRUCTURE_TYPE_APPLICATION_INFO) {
      __assert_fail("node.sType != static_cast<VkStructureType>(0) && \"Features struct sType must be filled with the struct\'s \" \"corresponding VkStructureType enum\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                    ,0x4de,
                    "Result<std::vector<PhysicalDevice>> vkb::PhysicalDeviceSelector::select_impl() const"
                   );
    }
  }
  if ((((this->criteria).require_present != false) &&
      ((this->criteria).defer_surface_initialization == false)) &&
     ((this->instance_info).surface == (VkSurfaceKHR)0x0)) {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 0;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&detail::physical_device_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    __return_storage_ptr__->m_init = false;
    return __return_storage_ptr__;
  }
  vk_physical_devices.
  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vk_physical_devices.
  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vk_physical_devices.
  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar3 = detail::
          get_vector<VkPhysicalDevice_T*,VkResult(*&)(VkInstance_T*,unsigned_int*,VkPhysicalDevice_T**),VkInstance_T*const&>
                    (&vk_physical_devices,
                     (_func_VkResult_VkInstance_T_ptr_uint_ptr_VkPhysicalDevice_T_ptr_ptr **)
                     (detail::vulkan_functions()::v + 0x78),(VkInstance_T **)this);
  ppVVar1 = vk_physical_devices.
            super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (VVar3 == VK_SUCCESS) {
    if (vk_physical_devices.
        super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vk_physical_devices.
        super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      fill_out_phys_dev_with_criteria.this = this;
      if ((this->criteria).use_first_gpu_unconditionally == true) {
        populate_device_details
                  (&physical_device,this,
                   *vk_physical_devices.
                    super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,src_extended_features_chain);
        select_impl::anon_class_8_1_8991fb9c::operator()
                  (&fill_out_phys_dev_with_criteria,&physical_device);
        PhysicalDevice::PhysicalDevice((PhysicalDevice *)&physical_devices,&physical_device);
        __l._M_len = 1;
        __l._M_array = (iterator)&physical_devices;
        std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::vector
                  (&local_dd8,__l,&local_e01);
        (__return_storage_ptr__->field_0).m_value.
        super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_dd8.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->field_0).m_value.
        super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_dd8.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->field_0).m_value.
        super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_dd8.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_dd8.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_dd8.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_dd8.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        __return_storage_ptr__->m_init = true;
        std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::~vector(&local_dd8);
        PhysicalDevice::~PhysicalDevice((PhysicalDevice *)&physical_devices);
        PhysicalDevice::~PhysicalDevice(&physical_device);
        goto LAB_0011ebb2;
      }
      physical_devices.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      physical_devices.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      physical_devices.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (ppVVar6 = vk_physical_devices.
                     super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pPVar2 = physical_devices.
                   super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
                   _M_impl.super__Vector_impl_data._M_finish, ppVVar6 != ppVVar1;
          ppVVar6 = ppVVar6 + 1) {
        populate_device_details(&physical_device,this,*ppVVar6,src_extended_features_chain);
        physical_device.suitable = is_device_suitable(this,&physical_device);
        if (physical_device.suitable != no) {
          std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::push_back
                    (&physical_devices,&physical_device);
        }
        PhysicalDevice::~PhysicalDevice(&physical_device);
      }
      lVar8 = 0x6bc;
      lVar7 = 0;
      for (lVar5 = ((long)physical_devices.
                          super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)physical_devices.
                         super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x6c0 >> 2; 0 < lVar5;
          lVar5 = lVar5 + -1) {
        if (*(int *)((long)&((physical_devices.
                              super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                              ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                    lVar8) != 0) {
          __seed._M_current =
               (PhysicalDevice *)
               ((long)physical_devices.
                      super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
                      _M_impl.super__Vector_impl_data._M_start - lVar7);
          goto LAB_0011ee1a;
        }
        if (*(int *)((long)&physical_devices.
                            super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].name._M_dataplus._M_p +
                    lVar8) != 0) {
          __seed._M_current =
               (PhysicalDevice *)
               ((long)physical_devices.
                      super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
                      _M_impl.super__Vector_impl_data._M_start + (0x6c0 - lVar7));
          goto LAB_0011ee1a;
        }
        if (*(int *)((long)&physical_devices.
                            super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                            ._M_impl.super__Vector_impl_data._M_start[2].name._M_dataplus._M_p +
                    lVar8) != 0) {
          __seed._M_current =
               (PhysicalDevice *)
               ((long)physical_devices.
                      super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
                      _M_impl.super__Vector_impl_data._M_start + (0xd80 - lVar7));
          goto LAB_0011ee1a;
        }
        if (*(int *)((long)&physical_devices.
                            super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                            ._M_impl.super__Vector_impl_data._M_start[3].name._M_dataplus._M_p +
                    lVar8) != 0) {
          __seed._M_current =
               (PhysicalDevice *)
               ((long)physical_devices.
                      super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
                      _M_impl.super__Vector_impl_data._M_start + (0x1440 - lVar7));
          goto LAB_0011ee1a;
        }
        lVar7 = lVar7 + -0x1b00;
        lVar8 = lVar8 + 0x1b00;
      }
      lVar5 = (((long)physical_devices.
                      super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)physical_devices.
                     super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
                     _M_impl.super__Vector_impl_data._M_start) + lVar7) / 0x6c0;
      __seed._M_current =
           (PhysicalDevice *)
           ((long)physical_devices.
                  super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
                  _M_impl.super__Vector_impl_data._M_start - lVar7);
      if (lVar5 == 1) {
LAB_0011edd8:
        if ((__seed._M_current)->suitable == yes) {
          __seed._M_current =
               physical_devices.
               super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl
               .super__Vector_impl_data._M_finish;
        }
LAB_0011ee1a:
        if (__seed._M_current !=
            physical_devices.
            super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>,_vkb::PhysicalDevice>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>,_vkb::PhysicalDevice>
                               *)&physical_device,__seed,
                              ((long)physical_devices.
                                     super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)__seed._M_current) / 0x6c0);
          std::
          __stable_partition_adaptive<__gnu_cxx::__normal_iterator<vkb::PhysicalDevice*,std::vector<vkb::PhysicalDevice,std::allocator<vkb::PhysicalDevice>>>,vkb::PhysicalDevice*,__gnu_cxx::__ops::_Iter_pred<vkb::PhysicalDeviceSelector::select_impl()const::__1>,long>
                    (__seed._M_current,pPVar2,physical_device.name._M_dataplus._M_p,
                     physical_device.name.field_2._M_allocated_capacity,
                     physical_device.name._M_string_length);
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>,_vkb::PhysicalDevice>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>,_vkb::PhysicalDevice>
                      *)&physical_device);
        }
      }
      else {
        if (lVar5 == 2) {
LAB_0011edc6:
          if ((__seed._M_current)->suitable == yes) {
            __seed._M_current = __seed._M_current + 1;
            goto LAB_0011edd8;
          }
          goto LAB_0011ee1a;
        }
        if (lVar5 == 3) {
          if (*(int *)((long)&((physical_devices.
                                super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                                ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                      lVar8) == 0) {
            __seed._M_current =
                 (PhysicalDevice *)
                 ((long)physical_devices.
                        super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                        ._M_impl.super__Vector_impl_data._M_start + (0x6c0 - lVar7));
            goto LAB_0011edc6;
          }
          goto LAB_0011ee1a;
        }
      }
      pPVar2 = physical_devices.
               super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (phys_dev = physical_devices.
                      super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
                      _M_impl.super__Vector_impl_data._M_start; phys_dev != pPVar2;
          phys_dev = phys_dev + 1) {
        select_impl::anon_class_8_1_8991fb9c::operator()(&fill_out_phys_dev_with_criteria,phys_dev);
      }
      (__return_storage_ptr__->field_0).m_value.
      super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
      super__Vector_impl_data._M_start =
           physical_devices.
           super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->field_0).m_value.
      super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
      super__Vector_impl_data._M_finish =
           physical_devices.
           super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->field_0).m_value.
      super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           physical_devices.
           super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      physical_devices.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      physical_devices.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      physical_devices.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __return_storage_ptr__->m_init = true;
      std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::~vector
                (&physical_devices);
      goto LAB_0011ebb2;
    }
    (__return_storage_ptr__->field_0).m_error.type._M_value = 2;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&detail::physical_device_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  }
  else {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 1;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&detail::physical_device_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VVar3;
  }
  __return_storage_ptr__->m_init = false;
LAB_0011ebb2:
  std::_Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::~_Vector_base
            (&vk_physical_devices.
              super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>);
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<PhysicalDevice>> PhysicalDeviceSelector::select_impl() const {
#if !defined(NDEBUG)
    // Validation
    for (const auto& node : criteria.extended_features_chain.nodes) {
        assert(node.sType != static_cast<VkStructureType>(0) &&
               "Features struct sType must be filled with the struct's "
               "corresponding VkStructureType enum");
        assert(node.sType != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 &&
               "Do not pass VkPhysicalDeviceFeatures2 as a required extension feature structure. An "
               "instance of this is managed internally for selection criteria and device creation.");
    }
#endif

    if (criteria.require_present && !criteria.defer_surface_initialization) {
        if (instance_info.surface == VK_NULL_HANDLE)
            return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::no_surface_provided };
    }

    // Get the VkPhysicalDevice handles on the system
    std::vector<VkPhysicalDevice> vk_physical_devices;

    auto vk_physical_devices_ret = detail::get_vector<VkPhysicalDevice>(
        vk_physical_devices, detail::vulkan_functions().fp_vkEnumeratePhysicalDevices, instance_info.instance);
    if (vk_physical_devices_ret != VK_SUCCESS) {
        return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::failed_enumerate_physical_devices, vk_physical_devices_ret };
    }
    if (vk_physical_devices.size() == 0) {
        return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::no_physical_devices_found };
    }

    auto fill_out_phys_dev_with_criteria = [&](PhysicalDevice& phys_dev) {
        phys_dev.features = criteria.required_features;
        phys_dev.extended_features_chain = criteria.extended_features_chain;
        bool portability_ext_available = false;
        for (const auto& ext : phys_dev.available_extensions)
            if (criteria.enable_portability_subset && ext == "VK_KHR_portability_subset")
                portability_ext_available = true;


        phys_dev.extensions_to_enable.clear();
        phys_dev.extensions_to_enable.insert(
            phys_dev.extensions_to_enable.end(), criteria.required_extensions.begin(), criteria.required_extensions.end());
        if (portability_ext_available) {
            phys_dev.extensions_to_enable.push_back("VK_KHR_portability_subset");
        }
    };

    // if this option is set, always return only the first physical device found
    if (criteria.use_first_gpu_unconditionally && vk_physical_devices.size() > 0) {
        PhysicalDevice physical_device = populate_device_details(vk_physical_devices[0], criteria.extended_features_chain);
        fill_out_phys_dev_with_criteria(physical_device);
        return std::vector<PhysicalDevice>{ physical_device };
    }

    // Populate their details and check their suitability
    std::vector<PhysicalDevice> physical_devices;
    for (auto& vk_physical_device : vk_physical_devices) {
        PhysicalDevice phys_dev = populate_device_details(vk_physical_device, criteria.extended_features_chain);
        phys_dev.suitable = is_device_suitable(phys_dev);
        if (phys_dev.suitable != PhysicalDevice::Suitable::no) {
            physical_devices.push_back(phys_dev);
        }
    }

    // sort the list into fully and partially suitable devices. use stable_partition to maintain relative order
    std::stable_partition(physical_devices.begin(), physical_devices.end(), [](auto const& pd) {
        return pd.suitable == PhysicalDevice::Suitable::yes;
    });

    // Make the physical device ready to be used to create a Device from it
    for (auto& physical_device : physical_devices) {
        fill_out_phys_dev_with_criteria(physical_device);
    }

    return physical_devices;
}